

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

void __thiscall PcodeOp::saveXml(PcodeOp *this,ostream *s)

{
  OpCode OVar1;
  spacetype sVar2;
  uintm uVar3;
  uint4 uVar4;
  ulong uVar5;
  size_type sVar6;
  AddrSpace *pAVar7;
  Address *pAVar8;
  SeqNum *this_00;
  string *psVar9;
  ostream *poVar10;
  void *pvVar11;
  AddrSpace *spc;
  string local_80 [32];
  PcodeOp *local_60;
  PcodeOp *indop;
  Varnode *vn;
  int4 i;
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  PcodeOp *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  std::operator<<(s,"<op");
  poVar10 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"code",&local_39);
  OVar1 = code(this);
  a_v_i(poVar10,(string *)local_38,(long)(int)OVar1);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::operator<<(local_18,">\n");
  SeqNum::saveXml(&this->start,local_18);
  std::operator<<(local_18,'\n');
  if (this->output == (Varnode *)0x0) {
    std::operator<<(local_18,"<void/>\n");
  }
  else {
    poVar10 = std::operator<<(local_18,"<addr ref=\"0x");
    pvVar11 = (void *)std::ostream::operator<<(poVar10,std::hex);
    uVar4 = Varnode::getCreateIndex(this->output);
    poVar10 = (ostream *)std::ostream::operator<<(pvVar11,uVar4);
    std::operator<<(poVar10,"\"/>\n");
  }
  for (vn._0_4_ = 0; uVar5 = (ulong)(int)vn,
      sVar6 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&this->inrefs), uVar5 < sVar6
      ; vn._0_4_ = (int)vn + 1) {
    indop = (PcodeOp *)getIn(this,(int)vn);
    if ((Varnode *)indop == (Varnode *)0x0) {
      std::operator<<(local_18,"<void/>\n");
    }
    else {
      pAVar7 = Varnode::getSpace((Varnode *)indop);
      sVar2 = AddrSpace::getType(pAVar7);
      if (sVar2 == IPTR_IOP) {
        if (((int)vn == 1) && (OVar1 = code(this), OVar1 == CPUI_INDIRECT)) {
          pAVar8 = Varnode::getAddr((Varnode *)indop);
          local_60 = getOpFromConst(pAVar8);
          std::operator<<(local_18,"<iop");
          poVar10 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_80,"value",(allocator *)((long)&spc + 7));
          this_00 = getSeqNum(local_60);
          uVar3 = SeqNum::getTime(this_00);
          a_v_u(poVar10,(string *)local_80,(ulong)uVar3);
          std::__cxx11::string::~string(local_80);
          std::allocator<char>::~allocator((allocator<char> *)((long)&spc + 7));
          std::operator<<(local_18,"/>\n");
        }
        else {
          std::operator<<(local_18,"<void/>\n");
        }
      }
      else {
        pAVar7 = Varnode::getSpace((Varnode *)indop);
        sVar2 = AddrSpace::getType(pAVar7);
        if (sVar2 == IPTR_CONSTANT) {
          if (((int)vn == 0) &&
             ((OVar1 = code(this), OVar1 == CPUI_STORE || (OVar1 = code(this), OVar1 == CPUI_LOAD)))
             ) {
            pAVar8 = Varnode::getAddr((Varnode *)indop);
            pAVar7 = Address::getSpaceFromConst(pAVar8);
            std::operator<<(local_18,"<spaceid name=\"");
            poVar10 = local_18;
            psVar9 = AddrSpace::getName_abi_cxx11_(pAVar7);
            poVar10 = std::operator<<(poVar10,(string *)psVar9);
            std::operator<<(poVar10,"\"/>\n");
          }
          else {
            poVar10 = std::operator<<(local_18,"<addr ref=\"0x");
            pvVar11 = (void *)std::ostream::operator<<(poVar10,std::hex);
            uVar4 = Varnode::getCreateIndex((Varnode *)indop);
            poVar10 = (ostream *)std::ostream::operator<<(pvVar11,uVar4);
            std::operator<<(poVar10,"\"/>\n");
          }
        }
        else {
          poVar10 = std::operator<<(local_18,"<addr ref=\"0x");
          pvVar11 = (void *)std::ostream::operator<<(poVar10,std::hex);
          uVar4 = Varnode::getCreateIndex((Varnode *)indop);
          poVar10 = (ostream *)std::ostream::operator<<(pvVar11,uVar4);
          std::operator<<(poVar10,"\"/>\n");
        }
      }
    }
  }
  std::operator<<(local_18,"</op>\n");
  return;
}

Assistant:

void PcodeOp::saveXml(ostream &s) const

{
  s << "<op";
  a_v_i(s,"code",(int4)code());
  s << ">\n";
  start.saveXml(s);
  s << '\n';
  if (output==(Varnode *)0)
    s << "<void/>\n";
  else
    s << "<addr ref=\"0x" << hex << output->getCreateIndex() << "\"/>\n";
  for(int4 i=0;i<inrefs.size();++i) {
    const Varnode *vn = getIn(i);
    if (vn == (const Varnode *)0)
      s << "<void/>\n";
    else if (vn->getSpace()->getType()==IPTR_IOP) {
      if ((i==1)&&(code()==CPUI_INDIRECT)) {
	PcodeOp *indop = PcodeOp::getOpFromConst(vn->getAddr());
	s << "<iop";
	a_v_u(s,"value",indop->getSeqNum().getTime());
	s << "/>\n";
      }
      else
	s << "<void/>\n";
    }
    else if (vn->getSpace()->getType()==IPTR_CONSTANT) {
      if ((i==0)&&((code()==CPUI_STORE)||(code()==CPUI_LOAD))) {
	AddrSpace *spc = Address::getSpaceFromConst(vn->getAddr());
	s << "<spaceid name=\"";
	s << spc->getName() << "\"/>\n";
      }
      else
	s << "<addr ref=\"0x" << hex << vn->getCreateIndex() << "\"/>\n";
    }
    else {
      s << "<addr ref=\"0x" << hex << vn->getCreateIndex() << "\"/>\n";
    }
  }
  s << "</op>\n";
}